

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

CMbuffer cm_get_data_buf(CManager_conflict cm,ssize_t length)

{
  _CMbuffer **pp_Var1;
  int iVar2;
  __pid_t _Var3;
  void *pvVar4;
  CMbuffer p_Var5;
  pthread_t pVar6;
  uint uVar7;
  char *__format;
  FILE *pFVar8;
  ulong uVar9;
  CMbuffer p_Var10;
  _CMbuffer *p_Var11;
  timespec ts;
  timespec local_40;
  
  p_Var10 = cm->cm_buffer_list;
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,CMBufferVerbose);
    if (iVar2 == 0) goto LAB_001151d8;
  }
  else if (CMtrace_val[9] == 0) goto LAB_001151d8;
  if (CMtrace_PID != 0) {
    pFVar8 = (FILE *)cm->CMTrace_file;
    _Var3 = getpid();
    pVar6 = pthread_self();
    fprintf(pFVar8,"P%lxT%lx - ",(long)_Var3,pVar6);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_40);
    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
  }
  fprintf((FILE *)cm->CMTrace_file,"cm_get_data_buf called with len %zu\n",length);
LAB_001151d8:
  fflush((FILE *)cm->CMTrace_file);
  if (p_Var10 != (CMbuffer)0x0) {
    uVar9 = 0;
    do {
      iVar2 = CMtrace_val[9];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(cm,CMBufferVerbose);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar8 = (FILE *)cm->CMTrace_file;
          _Var3 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar8,"P%lxT%lx - ",(long)_Var3,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"  buffer %d %p, size is %zd, data %p, ref_count %d\n",
                uVar9,p_Var10,p_Var10->size,p_Var10->buffer,p_Var10->ref_count);
      }
      fflush((FILE *)cm->CMTrace_file);
      uVar9 = (ulong)((int)uVar9 + 1);
      p_Var10 = p_Var10->next;
    } while (p_Var10 != (_CMbuffer *)0x0);
  }
  p_Var10 = cm->cm_buffer_list;
  if (p_Var10 == (CMbuffer)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      if (p_Var10->ref_count < 0) {
        iVar2 = CMtrace_val[9];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar2 = CMtrace_init(cm,CMBufferVerbose);
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            pFVar8 = (FILE *)cm->CMTrace_file;
            _Var3 = getpid();
            pVar6 = pthread_self();
            fprintf(pFVar8,"P%lxT%lx - ",(long)_Var3,pVar6);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_40);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,
                  "cm_get_data_buf buffer %p, ref_count is %d, should not be negative\n",p_Var10,
                  (ulong)(uint)p_Var10->ref_count);
        }
        fflush((FILE *)cm->CMTrace_file);
      }
      uVar7 = uVar7 + 1;
      p_Var10 = p_Var10->next;
    } while (p_Var10 != (_CMbuffer *)0x0);
    p_Var10 = cm->cm_buffer_list;
    p_Var11 = p_Var10;
    if (p_Var10 != (CMbuffer)0x0) {
      do {
        if (((p_Var11->ref_count < 1) && ((ulong)length <= p_Var11->size)) &&
           (p_Var11->size / 10 < (ulong)length)) {
          iVar2 = CMtrace_val[9];
          if (cm->CMTrace_file == (FILE *)0x0) {
            iVar2 = CMtrace_init(cm,CMBufferVerbose);
          }
          if (iVar2 != 0) {
            if (CMtrace_PID != 0) {
              pFVar8 = (FILE *)cm->CMTrace_file;
              _Var3 = getpid();
              pVar6 = pthread_self();
              fprintf(pFVar8,"P%lxT%lx - ",(long)_Var3,pVar6);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_40);
              fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
            }
            fprintf((FILE *)cm->CMTrace_file,
                    "cm_get_data_buf called len %zu, return existing %p, next %p, count %d\n",length
                    ,p_Var11,p_Var11->next,(ulong)uVar7);
          }
          fflush((FILE *)cm->CMTrace_file);
          p_Var11->ref_count = 1;
          return p_Var11;
        }
        pp_Var1 = &p_Var11->next;
        p_Var11 = *pp_Var1;
      } while (*pp_Var1 != (_CMbuffer *)0x0);
      p_Var5 = p_Var10;
      if (p_Var10 != (CMbuffer)0x0) {
        do {
          if ((p_Var5->ref_count < 1) && ((ulong)length <= p_Var5->size)) {
            pvVar4 = INT_CMrealloc(p_Var5->buffer,length);
            if (pvVar4 == (void *)0x0) {
              return (CMbuffer)0x0;
            }
            p_Var5->buffer = pvVar4;
            p_Var5->size = length;
            p_Var5->ref_count = 1;
            iVar2 = CMtrace_val[9];
            if (cm->CMTrace_file == (FILE *)0x0) {
              iVar2 = CMtrace_init(cm,CMBufferVerbose);
            }
            if (iVar2 == 0) goto LAB_00115569;
            if (CMtrace_PID != 0) {
              pFVar8 = (FILE *)cm->CMTrace_file;
              _Var3 = getpid();
              pVar6 = pthread_self();
              fprintf(pFVar8,"P%lxT%lx - ",(long)_Var3,pVar6);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_40);
              fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
            }
            pFVar8 = (FILE *)cm->CMTrace_file;
            __format = "      cm_get_data_buf resizing down!  return is %p\n";
            goto LAB_00115822;
          }
          pp_Var1 = &p_Var5->next;
          p_Var5 = *pp_Var1;
        } while (*pp_Var1 != (_CMbuffer *)0x0);
        while (p_Var5 = p_Var10, p_Var5 != (CMbuffer)0x0) {
          if ((p_Var5->ref_count < 1) && (p_Var5->size <= (ulong)length)) {
            pvVar4 = INT_CMrealloc(p_Var5->buffer,length);
            if (pvVar4 == (void *)0x0) {
              return (CMbuffer)0x0;
            }
            p_Var5->buffer = pvVar4;
            p_Var5->size = length;
            p_Var5->ref_count = 1;
            iVar2 = CMtrace_val[9];
            if (cm->CMTrace_file == (FILE *)0x0) {
              iVar2 = CMtrace_init(cm,CMBufferVerbose);
            }
            if (iVar2 != 0) {
              if (CMtrace_PID != 0) {
                pFVar8 = (FILE *)cm->CMTrace_file;
                _Var3 = getpid();
                pVar6 = pthread_self();
                fprintf(pFVar8,"P%lxT%lx - ",(long)_Var3,pVar6);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,&local_40);
                fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
              }
              pFVar8 = (FILE *)cm->CMTrace_file;
              __format = "      cm_get_data_buf resizingup!  return is %p\n";
LAB_00115822:
              fprintf(pFVar8,__format,p_Var5);
            }
            goto LAB_00115569;
          }
          p_Var10 = p_Var5->next;
        }
      }
    }
  }
  pvVar4 = INT_CMmalloc(length);
  p_Var5 = cm_create_transport_buffer(cm,pvVar4,length);
  p_Var5->ref_count = 1;
  p_Var5->next = cm->cm_buffer_list;
  cm->cm_buffer_list = p_Var5;
  iVar2 = CMtrace_val[9];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,CMBufferVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      pFVar8 = (FILE *)cm->CMTrace_file;
      _Var3 = getpid();
      pVar6 = pthread_self();
      fprintf(pFVar8,"P%lxT%lx - ",(long)_Var3,pVar6);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"cm_get_data_buf create new len %zu, return %p, count %d\n",
            length,p_Var5,(ulong)uVar7);
  }
LAB_00115569:
  fflush((FILE *)cm->CMTrace_file);
  return p_Var5;
}

Assistant:

extern CMbuffer
 cm_get_data_buf(CManager cm, ssize_t length)  
 {
     int buffer_count = 0;
     CMbuffer tmp = cm->cm_buffer_list;

     CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf called with len %zu\n",
		 length);
     while (tmp != NULL) {
	 CMtrace_out(cm, CMBufferVerbose, "  buffer %d %p, size is %zd, data %p, ref_count %d\n",
		     buffer_count, tmp, tmp->size, tmp->buffer, tmp->ref_count);
	 buffer_count++;
	 tmp = tmp->next;
     }

     tmp = cm->cm_buffer_list;
     buffer_count = 0;
     /* first baseline consistency check */
     while (tmp != NULL) {
	 if (tmp->ref_count < 0) {
	     CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf buffer %p, ref_count is %d, should not be negative\n", tmp, tmp->ref_count);
	 }
	 buffer_count++;
	 tmp = tmp->next;
     }
     /* first look for a buffer big enough, but not too big */
     tmp = cm->cm_buffer_list;
     while (tmp != NULL) {
	 if (tmp->ref_count <= 0) {
	     if ((tmp->size >= (size_t)length) && ((tmp->size/10) < (size_t)length)) {
		 CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf called len %zu, return existing %p, next %p, count %d\n",
			     length, tmp, tmp->next, buffer_count);
		 tmp->ref_count = 1;
		 return tmp;
	     }
	 }
	 tmp = tmp->next;
     }		
     /* ok, we'll settle for way too big, but realloc it down */
     tmp = cm->cm_buffer_list;
     while (tmp != NULL) {
	 if (tmp->ref_count <= 0) {
	     if ((tmp->size >= (size_t)length)) {
		 char *t = INT_CMrealloc(tmp->buffer, length);
		 if (t == NULL) {
		     return NULL;
		 }
		 tmp->buffer = t;
		 tmp->size = length;
		 tmp->ref_count = 1;
		 CMtrace_out(cm, CMBufferVerbose, "      cm_get_data_buf resizing down!  return is %p\n", tmp);
		 return tmp;
	     }
	 }
	 tmp = tmp->next;
     }		
     tmp = cm->cm_buffer_list;
     /* well, look for a small one to realloc up */
     while (tmp != NULL) {
	 if (tmp->ref_count <= 0) {
	     if (tmp->size <= (size_t)length) {
		 char *t = INT_CMrealloc(tmp->buffer, length);
		 if (t == NULL) {
		     return NULL;
		 }
		 tmp->buffer = t;
		 tmp->size = length;
		 tmp->ref_count = 1;
		 CMtrace_out(cm, CMBufferVerbose, "      cm_get_data_buf resizingup!  return is %p\n", tmp);
		 return tmp;
	     }
	 }
	 tmp = tmp->next;
     }
     tmp = cm_create_transport_buffer(cm, INT_CMmalloc(length), length);
     tmp->ref_count = 1;
     tmp->next = cm->cm_buffer_list;
     cm->cm_buffer_list = tmp;
     CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf create new len %zu, return %p, count %d\n",
		 length, tmp, buffer_count);
     return tmp;
 }